

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall LoginRequest::LoginRequest(LoginRequest *this,Event *e)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keysToBeInEvent;
  bool bVar1;
  EventNotValid *this_00;
  string *local_1a8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_120 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_100 [2];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [36];
  undefined1 local_b4;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  string *local_b0;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  iterator local_48;
  undefined8 local_40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  Event *local_18;
  Event *e_local;
  LoginRequest *this_local;
  
  local_18 = e;
  e_local = (Event *)this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->password);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_28,e);
  local_b4 = 1;
  local_b0 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"type",&local_b1);
  local_b0 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"username",&local_b2);
  local_b0 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"password",&local_b3);
  local_b4 = 0;
  local_48 = (iterator)local_a8;
  local_40 = 3;
  keysToBeInEvent._M_len = 3;
  keysToBeInEvent._M_array = local_48;
  bVar1 = checkEventKeys(&local_28,keysToBeInEvent);
  local_1a8 = (string *)&local_48;
  do {
    local_1a8 = local_1a8 + -0x20;
    std::__cxx11::string::~string(local_1a8);
  } while (local_1a8 != local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b3);
  std::allocator<char>::~allocator((allocator<char> *)&local_b2);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)e,"username");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_100);
    std::__cxx11::string::operator=((string *)this,(string *)local_100);
    std::__cxx11::string::~string((string *)local_100);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)e,"password");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_120);
    std::__cxx11::string::operator=((string *)&this->password,(string *)local_120);
    std::__cxx11::string::~string((string *)local_120);
    return;
  }
  local_da = 1;
  this_00 = (EventNotValid *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Improper LOGIN_REQUEST",&local_d9);
  EventNotValid::EventNotValid(this_00,(string *)local_d8);
  local_da = 0;
  __cxa_throw(this_00,&EventNotValid::typeinfo,EventNotValid::~EventNotValid);
}

Assistant:

explicit LoginRequest(Event e){
        if(!checkEventKeys(e, {"type", "username", "password"})) {
            throw EventNotValid("Improper LOGIN_REQUEST");
        }
        try{
            username = e["username"].get<std::string>();
            password = e["password"].get<std::string>();
        }
        catch(...){
            throw EventNotValid("Improper LOGIN_REQUEST");
        }
    }